

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

DWORD FlatStream_CheckFile(TBlockStream *pStream)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = pStream->BlockCount;
  if (7 < uVar1) {
    uVar2 = 0;
    do {
      if (*(char *)((long)pStream->FileBitmap + uVar2) != -1) {
        return 0;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 >> 3 != uVar2);
  }
  if (((uVar1 & 7) != 0) &&
     (((uint)*(byte *)((long)pStream->FileBitmap + (ulong)(uVar1 >> 3)) ^ -1 << (sbyte)(uVar1 & 7))
      != 0xffffffff)) {
    return 0;
  }
  return 1;
}

Assistant:

static DWORD FlatStream_CheckFile(TBlockStream * pStream)
{
    LPBYTE FileBitmap = (LPBYTE)pStream->FileBitmap;
    DWORD WholeByteCount = (pStream->BlockCount / 8);
    DWORD ExtraBitsCount = (pStream->BlockCount & 7);
    BYTE ExpectedValue;

    // Verify the whole bytes - their value must be 0xFF
    for(DWORD i = 0; i < WholeByteCount; i++)
    {
        if(FileBitmap[i] != 0xFF)
            return 0;
    }

    // If there are extra bits, calculate the mask
    if(ExtraBitsCount != 0)
    {
        ExpectedValue = (BYTE)((1 << ExtraBitsCount) - 1);
        if(FileBitmap[WholeByteCount] != ExpectedValue)
            return 0;
    }

    // Yes, the file is complete
    return 1;
}